

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaPat.c
# Opt level: O1

void Gia_SatCollectCone_rec(Gia_Man_t *p,Gia_Obj_t *pObj,Vec_Int_t *vVisit)

{
  uint uVar1;
  ulong uVar2;
  Gia_Obj_t *pGVar3;
  int *piVar4;
  int iVar5;
  
  uVar2 = *(ulong *)pObj;
  if (((uint)(uVar2 >> 0x1e) & 1 | (uint)(uVar2 >> 0x3d) & 2) == 3) {
    return;
  }
  if ((uVar2 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar2) {
    Gia_SatCollectCone_rec(p,pObj + -(uVar2 & 0x1fffffff),vVisit);
    Gia_SatCollectCone_rec(p,pObj + -(ulong)(*(uint *)&pObj->field_0x4 & 0x1fffffff),vVisit);
  }
  uVar2 = *(ulong *)pObj;
  if ((uVar2 >> 0x1e & 1) != 0 || ((uint)(uVar2 >> 0x3d) & 2) != 0) {
    __assert_fail("Sat_ObjXValue(pObj) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaPat.c"
                  ,0x39,"void Gia_SatCollectCone_rec(Gia_Man_t *, Gia_Obj_t *, Vec_Int_t *)");
  }
  *(ulong *)pObj = uVar2 | 0x4000000040000000;
  pGVar3 = p->pObjs;
  if ((pObj < pGVar3) || (pGVar3 + p->nObjs <= pObj)) {
    __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                  ,0x1ab,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
  }
  uVar1 = vVisit->nCap;
  if (vVisit->nSize == uVar1) {
    if ((int)uVar1 < 0x10) {
      if (vVisit->pArray == (int *)0x0) {
        piVar4 = (int *)malloc(0x40);
      }
      else {
        piVar4 = (int *)realloc(vVisit->pArray,0x40);
      }
      vVisit->pArray = piVar4;
      iVar5 = 0x10;
    }
    else {
      iVar5 = uVar1 * 2;
      if (iVar5 <= (int)uVar1) goto LAB_007016d0;
      if (vVisit->pArray == (int *)0x0) {
        piVar4 = (int *)malloc((ulong)uVar1 << 3);
      }
      else {
        piVar4 = (int *)realloc(vVisit->pArray,(ulong)uVar1 << 3);
      }
      vVisit->pArray = piVar4;
    }
    if (piVar4 == (int *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                    ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    vVisit->nCap = iVar5;
  }
LAB_007016d0:
  iVar5 = vVisit->nSize;
  vVisit->nSize = iVar5 + 1;
  vVisit->pArray[iVar5] = (int)((ulong)((long)pObj - (long)pGVar3) >> 2) * -0x55555555;
  return;
}

Assistant:

void Gia_SatCollectCone_rec( Gia_Man_t * p, Gia_Obj_t * pObj, Vec_Int_t * vVisit )
{
    if ( Sat_ObjXValue(pObj) == GIA_UND )
        return;
    if ( Gia_ObjIsAnd(pObj) )
    {
        Gia_SatCollectCone_rec( p, Gia_ObjFanin0(pObj), vVisit );
        Gia_SatCollectCone_rec( p, Gia_ObjFanin1(pObj), vVisit );
    }
    assert( Sat_ObjXValue(pObj) == 0 );
    Sat_ObjSetXValue( pObj, GIA_UND );
    Vec_IntPush( vVisit, Gia_ObjId(p, pObj) );
}